

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

SimComponent * __thiscall lsim::Simulator::create_component(Simulator *this,ModelComponent *desc)

{
  pointer *pppSVar1;
  pointer puVar2;
  pointer puVar3;
  iterator __position;
  iterator iVar4;
  _Head_base<0UL,_lsim::SimComponent_*,_false> _Var5;
  SimComponent *this_00;
  ulong uVar6;
  pointer result;
  _Head_base<0UL,_lsim::SimComponent_*,_false> local_38;
  _Head_base<0UL,_lsim::SimComponent_*,_false> local_30;
  unsigned_long local_28;
  
  puVar2 = (this->m_components).
           super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->m_components).
           super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (SimComponent *)operator_new(0x78);
  SimComponent::SimComponent
            (this_00,this,desc,(uint32_t)((ulong)((long)puVar2 - (long)puVar3) >> 3));
  local_38._M_head_impl = this_00;
  local_30._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>,std::allocator<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>>>
  ::emplace_back<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>>
            ((vector<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>,std::allocator<std::unique_ptr<lsim::SimComponent,std::default_delete<lsim::SimComponent>>>>
              *)&this->m_components,
             (unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_> *)&local_30);
  local_28 = 0;
  __position._M_current =
       (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->m_input_changed,__position,&local_28);
  }
  else {
    *__position._M_current = 0;
    (this->m_input_changed).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  uVar6 = (ulong)desc->m_type;
  if (uVar6 < 0x402) {
    if ((this->m_sim_functions).
        super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_elems[0].super__Function_base._M_manager
        != (_Manager_type)0x0) {
      iVar4._M_current =
           (this->m_init_components).
           super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_init_components).
          super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>>::
        _M_realloc_insert<lsim::SimComponent*const&>
                  ((vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>> *)
                   &this->m_init_components,iVar4,&local_38._M_head_impl);
        uVar6 = (ulong)desc->m_type;
        if (0x401 < desc->m_type) goto LAB_0017b473;
      }
      else {
        *iVar4._M_current = this_00;
        pppSVar1 = &(this->m_init_components).
                    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    if ((this->m_sim_functions).
        super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_elems[2].super__Function_base._M_manager
        != (_Manager_type)0x0) {
      iVar4._M_current =
           (this->m_independent_components).
           super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_independent_components).
          super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>>::
        _M_realloc_insert<lsim::SimComponent*const&>
                  ((vector<lsim::SimComponent*,std::allocator<lsim::SimComponent*>> *)
                   &this->m_independent_components,iVar4,&local_38._M_head_impl);
      }
      else {
        *iVar4._M_current = local_38._M_head_impl;
        pppSVar1 = &(this->m_independent_components).
                    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    _Var5._M_head_impl = local_38._M_head_impl;
    if (local_30._M_head_impl != (SimComponent *)0x0) {
      std::default_delete<lsim::SimComponent>::operator()
                ((default_delete<lsim::SimComponent> *)&local_30,local_30._M_head_impl);
    }
    return _Var5._M_head_impl;
  }
LAB_0017b473:
  __assert_fail("comp_type <= COMPONENT_MAX_TYPE_ID",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x111,"bool lsim::Simulator::component_has_function(ComponentType, SimFuncType)");
}

Assistant:

SimComponent *Simulator::create_component(ModelComponent *desc) {
    auto sim_comp = std::make_unique<SimComponent>(this, desc, static_cast<uint32_t> (m_components.size()));
    auto result = sim_comp.get();

    m_components.push_back(std::move(sim_comp));
	m_input_changed.push_back(0);

    if (component_has_function(desc->type(), SIM_FUNCTION_SETUP)) {
        m_init_components.push_back(result);       
    }

    if (component_has_function(desc->type(), SIM_FUNCTION_INDEPENDENT)) {
        m_independent_components.push_back(result);
    }

    return result;
}